

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_actor::state_read(se_actor *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  uchar value;
  int local_1c;
  
  cse_alife_creature_actor::state_read(&this->super_cse_alife_creature_actor,packet,size);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28;
  if (uVar1 < 0x80) {
    if (uVar1 < 0x7a) {
      if ((ushort)(uVar1 - 0x27) < 0x50) {
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0xa2,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    if (0x7c < uVar1) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x34,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_actor");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CRandomTask");
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x3b,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"object_collection");
    r_object_collection(packet);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"object_collection");
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x41,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x43,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CRandomTask");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"object_collection");
    r_object_collection(packet);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"object_collection");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CMinigames");
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x4e,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"test_crowkiller");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x50,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"CMGCrowKiller");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x52,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"valiable");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x54,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CMGCrowKiller");
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x57,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 0x3c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x59,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x5b,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\x04') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x5d,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,4);
    if (local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x5f,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 10) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x61,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 100) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,99,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x65,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    if (*pcVar3 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x67,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x69,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x6b,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 10) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x6d,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x6f,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x71,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CMGCrowKiller");
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"test_shooting");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x75,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"CMGShooting");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x77,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"valiable");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x79,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CMGShooting");
    pcVar3 = xr_packet::skip_sz(packet);
    if (*pcVar3 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x7c,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    if (*pcVar3 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x7e,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x80,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x82,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x84,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x86,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x88,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\x01') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x8a,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,2);
    if ((short)local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x8c,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x8e,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x90,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x92,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x94,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,1);
    if ((char)local_1c != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x96,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1c,4);
    if (local_1c != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x98,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x9a,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CMGShooting");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CMinigames");
  }
  else {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_actor");
    xr_packet::r_raw(packet,&local_1c,1);
  }
  cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_actor");
  return;
}

Assistant:

void se_actor::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_creature_actor::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		set_save_marker(packet, SM_LOAD, false, "se_actor");
		
		bool start_position_filled = packet.r_bool();
		
		set_save_marker(packet, SM_LOAD, true, "se_actor");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_LOAD, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_LOAD, false, "CRandomTask");
		if (packet.r_u16())			// #inited_tasks
			xr_not_implemented();
		// CRandomTask's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");
		if (packet.r_u8())			// #rewards
			xr_not_implemented();
		if (packet.r_u16())			// #inited_find_upgrade_tasks
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_LOAD, false, "CMinigames");
		if (packet.r_u16() != 2)		// #minigames
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "test_crowkiller"))	// first minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGCrowKiller"))	// first minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// first minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGCrowKiller");
		if (packet.r_u8())			// params_list.highscore
			xr_not_implemented();
		if (packet.r_u16() != 60)		// params_list.timer
			xr_not_implemented();
		if (packet.r_bool())			// params_list.win
			xr_not_implemented();
		if (packet.r_u8() != 4)			// #params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u32())			// params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u16() != 10)		// params_list.money_multiplier
			xr_not_implemented();
		if (packet.r_u16() != 100)		// params_list.champion_multiplier
			xr_not_implemented();
		if (packet.r_u8())			// params_list.selected
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))	// params_list.game_type
			xr_not_implemented();
		if (packet.r_u8())			// high_score
			xr_not_implemented();
		if (packet.r_u16())			// timer
			xr_not_implemented();
		if (packet.r_u16() != 10)		// time_out
			xr_not_implemented();
		if (packet.r_u8())			// killed_counter
			xr_not_implemented();
		if (packet.r_bool())			// win
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGCrowKiller");

		if (std::strcmp(packet.skip_sz(), "test_shooting"))	// second minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGShooting"))	// second minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// second minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGShooting");
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.game_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.wpn_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.obj_name
			xr_not_implemented();
		if (packet.r_u8() != 1)				// params_list.win type
			xr_not_implemented();
		if (packet.r_u16())				// params_list.win
			xr_not_implemented();
		if (packet.r_u8())				// params_list.distance
			xr_not_implemented();
		if (packet.r_u8())				// params_list.ammo
			xr_not_implemented();
		if (packet.r_u8())				// #params_list.targets
			xr_not_implemented();
		if (packet.r_u8())				// params_list.target_counter
			xr_not_implemented();
		if (packet.r_u8())				// #inventory_items
			xr_not_implemented();
		if (packet.r_u32())				// prev_time
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// cur_game
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGShooting");
		set_save_marker(packet, SM_LOAD, true, "CMinigames");

		set_save_marker(packet, SM_LOAD, true, "se_actor");
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_SOC) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}